

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O2

bool __thiscall
helics::TimeDependencies::checkIfAllDependenciesArePastExec(TimeDependencies *this,bool iterating)

{
  DependencyInfo *pDVar1;
  bool bVar2;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  __it;
  long lVar3;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  _Var4;
  long lVar5;
  _Iter_negate<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_TimeDependencies_cpp:469:66)>
  local_31;
  
  __it._M_current =
       (this->dependencies).
       super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  pDVar1 = (this->dependencies).
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pDVar1 - (long)__it._M_current;
  for (lVar3 = lVar5 / 0x58 >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<helics::TimeDependencies::checkIfAllDependenciesArePastExec(bool)const::$_0>
            ::operator()(&local_31,__it);
    _Var4._M_current = __it._M_current;
    if (bVar2) goto LAB_002a4a41;
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<helics::TimeDependencies::checkIfAllDependenciesArePastExec(bool)const::$_0>
            ::operator()(&local_31,__it._M_current + 1);
    _Var4._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_002a4a41;
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<helics::TimeDependencies::checkIfAllDependenciesArePastExec(bool)const::$_0>
            ::operator()(&local_31,__it._M_current + 2);
    _Var4._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_002a4a41;
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<helics::TimeDependencies::checkIfAllDependenciesArePastExec(bool)const::$_0>
            ::operator()(&local_31,__it._M_current + 3);
    _Var4._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_002a4a41;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x160;
  }
  lVar5 = lVar5 / 0x58;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var4._M_current = pDVar1;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_negate<helics::TimeDependencies::checkIfAllDependenciesArePastExec(bool)const::$_0>
                  ::operator()(&local_31,__it), _Var4._M_current = __it._M_current, bVar2))
      goto LAB_002a4a41;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<helics::TimeDependencies::checkIfAllDependenciesArePastExec(bool)const::$_0>
            ::operator()(&local_31,__it);
    _Var4._M_current = __it._M_current;
    if (bVar2) goto LAB_002a4a41;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_negate<helics::TimeDependencies::checkIfAllDependenciesArePastExec(bool)const::$_0>
          ::operator()(&local_31,__it);
  _Var4._M_current = __it._M_current;
  if (!bVar2) {
    _Var4._M_current = pDVar1;
  }
LAB_002a4a41:
  return _Var4._M_current == pDVar1;
}

Assistant:

bool TimeDependencies::checkIfAllDependenciesArePastExec(bool iterating) const
{
    auto minstate =
        iterating ? TimeState::time_requested_require_iteration : TimeState::time_requested;

    return std::all_of(dependencies.begin(), dependencies.end(), [minstate](const auto& dep) {
        return ((!dep.dependency) || (dep.connection == ConnectionType::SELF) ||
                (dep.mTimeState >= minstate) ||
                (dep.mTimeState == TimeState::time_granted && dep.next > timeZero));
    });

    /* return std::none_of(dependencies.begin(), dependencies.end(), [minstate](const auto& dep) {
         return (dep.dependency && dep.connection != ConnectionType::SELF &&
                 (dep.mTimeState < minstate));
     });*/
}